

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O2

int __thiscall Group::build(Group *this,int *v,int vn,int c)

{
  pointer pBVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int i;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_fjzzq2002[P]MiniShader_group_h:26:21)>
  __comp;
  int c_local;
  long local_c0;
  uint local_b4;
  int local_b0;
  float local_ac;
  long local_a8;
  int *local_a0;
  long local_98;
  BoundingBox local_90;
  BoundingBox local_78;
  BoundingBox local_60;
  BoundingBox local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  if (vn == 1) {
    local_b0 = *v;
  }
  else {
    local_b0 = this->bn;
    local_98 = (long)local_b0;
    this->bn = local_b0 + 1;
    local_a8 = (long)vn;
    __comp._M_comp.c = &c_local;
    __comp._M_comp.this = this;
    c_local = c;
    std::
    __sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Group::build(int*,int,int)::_lambda(int,int)_1_>>
              (v,v + local_a8,__comp);
    BoundingBox::operator=
              ((this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
               super__Vector_impl_data._M_start,&BoundingBox::EMPTY);
    local_c0 = (ulong)(uint)(~(vn >> 0x1f) & vn) * 0x18;
    local_b4 = vn;
    local_a0 = v;
    for (lVar10 = 0; local_c0 != lVar10; lVar10 = lVar10 + 0x18) {
      pBVar1 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
               super__Vector_impl_data._M_start;
      BoundingBox::BoundingBox
                (&local_48,
                 (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start + *v);
      BoundingBox::operator|
                (&local_90,(BoundingBox *)((long)(pBVar1->a).m_elements + lVar10),&local_48);
      BoundingBox::operator=
                ((BoundingBox *)
                 ((long)(this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].a.m_elements + lVar10),&local_90
                );
      v = v + 1;
    }
    BoundingBox::operator=
              ((this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
               super__Vector_impl_data._M_start + local_a8,&BoundingBox::EMPTY);
    uVar12 = (ulong)local_b4;
    lVar10 = uVar12 * 0x18;
    for (; uVar5 = local_b4, 0 < (int)uVar12; uVar12 = uVar12 - 1) {
      pBVar1 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
               super__Vector_impl_data._M_start;
      BoundingBox::BoundingBox
                (&local_60,
                 (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start + local_a0[uVar12 - 1]);
      BoundingBox::operator|
                (&local_90,(BoundingBox *)((long)(pBVar1->a).m_elements + lVar10),&local_60);
      BoundingBox::operator=
                ((BoundingBox *)
                 ((long)(this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>.
                        _M_impl.super__Vector_impl_data._M_start[-1].a.m_elements + lVar10),
                 &local_90);
      lVar10 = lVar10 + -0x18;
    }
    iVar8 = (int)((long)(int)local_b4 / 2);
    uVar11 = (long)(int)local_b4 / 2 & 0xffffffff;
    fVar13 = BoundingBox::area((this->t1).
                               super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl
                               .super__Vector_impl_data._M_start + iVar8);
    local_c0 = CONCAT44(local_c0._4_4_,fVar13);
    auVar14._0_4_ =
         BoundingBox::area((this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar8);
    lVar6 = local_a8;
    auVar14._4_60_ = extraout_var;
    auVar3 = vmaxss_avx(auVar14._0_16_,ZEXT416((uint)(float)local_c0));
    lVar10 = 0x18;
    for (uVar12 = 1; piVar7 = local_a0, (long)uVar12 < lVar6; uVar12 = uVar12 + 1) {
      local_c0 = CONCAT44(local_c0._4_4_,auVar3._0_4_);
      local_ac = BoundingBox::area((BoundingBox *)
                                   ((long)(((this->t1).
                                            super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->a).
                                          m_elements + lVar10));
      auVar15._0_4_ =
           BoundingBox::area((BoundingBox *)
                             ((long)(((this->t2).
                                      super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->a).m_elements +
                             lVar10));
      auVar15._4_60_ = extraout_var_00;
      auVar4 = vmaxss_avx(auVar15._0_16_,ZEXT416((uint)local_ac));
      auVar3 = vminss_avx(auVar4,ZEXT416((uint)(float)local_c0));
      if (auVar4._0_4_ < (float)local_c0) {
        uVar11 = uVar12 & 0xffffffff;
      }
      lVar10 = lVar10 + 0x18;
    }
    iVar9 = (int)uVar11;
    iVar8 = build(this,local_a0,iVar9,(c_local + 1) % 3);
    lVar10 = local_98;
    (this->ch).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_98 * 2] = iVar8;
    iVar8 = (int)local_98;
    iVar9 = build(this,piVar7 + iVar9,uVar5 - iVar9,(c_local + 1) % 3);
    piVar2 = (this->ch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[iVar8 * 2 + 1] = iVar9;
    iVar8 = piVar2[lVar10 * 2];
    pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    BoundingBox::BoundingBox(&local_78,pBVar1 + iVar9);
    BoundingBox::operator|(&local_90,pBVar1 + iVar8,&local_78);
    BoundingBox::operator=
              ((this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
               super__Vector_impl_data._M_start + lVar10,&local_90);
  }
  return local_b0;
}

Assistant:

int build(int* v,int vn,int c=0)
	{
//		cerr << vn << "!" << v[0] << "!!\n";
//		for (int j = 0; j < vn; ++j) cerr << v[j] << "|"; cerr << "EZ\n";
		if (vn == 1) return v[0];
		int p = bn++;
		std::sort(v,v+vn, [&](int p, int q) {return box[p].a[c] + box[p].b[c] < box[q].a[c] + box[q].b[c]; });
		t1[0] = BoundingBox::EMPTY;
		for (int i = 0; i < vn; ++i)
			t1[i+1] = t1[i] | box[v[i]];
		t2[vn] = BoundingBox::EMPTY;
		for (int i = vn - 1; i >= 0; --i)
			t2[i] = t2[i + 1] | box[v[i]];
		int I=vn/2;
		float mxx = std::max(t1[I].area(),t2[I].area());
		for (int i = 1; i < vn; ++i)
		{
			float ma = std::max(t1[i].area(), t2[i].area());
			if (ma < mxx) mxx = ma, I = i;
		}
		ch[p * 2] = build(v, I, (c+1)%3);
//		cerr << p << "FIRSTHALF ED\n";
		ch[p * 2 + 1] = build(v + I, vn - I,(c+1)%3);
		box[p] = box[ch[p * 2]] | box[ch[p * 2 + 1]];
		return p;
	}